

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

string * __thiscall
cmTarget::ImportedGetFullPath
          (string *__return_storage_ptr__,cmTarget *this,string *config,ArtifactType artifact)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  bool bVar4;
  char *pcVar5;
  string impProp;
  char *imp;
  char *loc;
  string desired_config;
  string suffix;
  string local_c8;
  string local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  char *local_80;
  char *local_78;
  string local_70;
  string local_50;
  
  if (this->IsImportedTarget == false) {
    __assert_fail("this->IsImported()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmTarget.cxx"
                  ,0x56e,
                  "std::string cmTarget::ImportedGetFullPath(const std::string &, cmStateEnums::ArtifactType) const"
                 );
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar2 = (config->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + config->_M_string_length);
  if (config->_M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)local_70._M_string_length,0x56b76c);
  }
  local_88 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_88;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78 = (char *)0x0;
  local_80 = (char *)0x0;
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if ((this->TargetTypeValue == INTERFACE_LIBRARY) ||
     (bVar4 = GetMappedConfig(this,&local_70,&local_78,&local_80,&local_50), !bVar4))
  goto LAB_0040d026;
  if (artifact == RuntimeBinaryArtifact) {
    pcVar5 = local_78;
    if (local_78 != (char *)0x0) {
LAB_0040ceda:
      pcVar3 = (char *)__return_storage_ptr__->_M_string_length;
      strlen(pcVar5);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar3,(ulong)pcVar5);
      goto LAB_0040d026;
    }
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"IMPORTED_LOCATION","");
    std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_50._M_dataplus._M_p);
    pcVar5 = GetProperty(this,&local_c8);
    if (pcVar5 == (char *)0x0) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"IMPORTED_LOCATION","");
      pcVar5 = GetProperty(this,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (pcVar5 != (char *)0x0) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar5);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar5);
    }
  }
  else {
    if (artifact != ImportLibraryArtifact) goto LAB_0040d026;
    pcVar5 = local_80;
    if (local_80 != (char *)0x0) goto LAB_0040ceda;
    if ((this->TargetTypeValue != SHARED_LIBRARY) && (bVar4 = IsExecutableWithExports(this), !bVar4)
       ) goto LAB_0040d026;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"IMPORTED_IMPLIB","");
    std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_50._M_dataplus._M_p);
    pcVar5 = GetProperty(this,&local_c8);
    if (pcVar5 == (char *)0x0) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"IMPORTED_IMPLIB","");
      pcVar5 = GetProperty(this,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (pcVar5 != (char *)0x0) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar5);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar5);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
LAB_0040d026:
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::ImportedGetFullPath(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  assert(this->IsImported());

  // Lookup/compute/cache the import information for this
  // configuration.
  std::string desired_config = config;
  if (config.empty()) {
    desired_config = "NOCONFIG";
  }

  std::string result;

  const char* loc = CM_NULLPTR;
  const char* imp = CM_NULLPTR;
  std::string suffix;

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetMappedConfig(desired_config, &loc, &imp, suffix)) {
    switch (artifact) {
      case cmStateEnums::RuntimeBinaryArtifact:
        if (loc) {
          result = loc;
        } else {
          std::string impProp = "IMPORTED_LOCATION";
          impProp += suffix;
          if (const char* config_location = this->GetProperty(impProp)) {
            result = config_location;
          } else if (const char* location =
                       this->GetProperty("IMPORTED_LOCATION")) {
            result = location;
          }
        }
        break;

      case cmStateEnums::ImportLibraryArtifact:
        if (imp) {
          result = imp;
        } else if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
                   this->IsExecutableWithExports()) {
          std::string impProp = "IMPORTED_IMPLIB";
          impProp += suffix;
          if (const char* config_implib = this->GetProperty(impProp)) {
            result = config_implib;
          } else if (const char* implib =
                       this->GetProperty("IMPORTED_IMPLIB")) {
            result = implib;
          }
        }
        break;
    }
  }

  if (result.empty()) {
    result = this->GetName();
    result += "-NOTFOUND";
  }
  return result;
}